

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_54919::SetSourceiv
          (anon_unknown_dwarf_54919 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<const_int,_18446744073709551615UL> values)

{
  int *piVar1;
  uint uVar2;
  ALCdevice *device;
  Voice *pVVar3;
  undefined8 *puVar4;
  pointer pBVar5;
  pointer pFVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined8 *puVar11;
  undefined4 in_register_0000000c;
  uint *puVar12;
  ulong uVar13;
  long lVar14;
  pthread_mutex_t *__mutex;
  pointer piVar15;
  optional<(anonymous_namespace)::VoicePos> *poVar16;
  char *pcVar17;
  ulong uVar18;
  undefined8 uVar19;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> temp;
  ALCcontext *Context_00;
  ALenum AVar20;
  long lVar21;
  span<const_float,_18446744073709551615UL> values_00;
  unique_lock<std::mutex> slotlock;
  unique_lock<std::mutex> local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float afStack_6c [3];
  optional<(anonymous_namespace)::VoicePos> local_60;
  undefined1 local_48 [16];
  BufferlistItem *pBStack_38;
  
  puVar12 = (uint *)CONCAT44(in_register_0000000c,prop);
  values_00.mDataEnd = (pointer)values.mDataEnd;
  piVar15 = values.mData;
  iVar9 = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  device = *(ALCdevice **)&Source[1].mDistanceModel;
  local_88._M_device = (mutex_type *)0x0;
  local_88._M_owns = false;
  if (0x1211 < iVar9) {
    if (iVar9 < 0xd000) {
      if (iVar9 == 0x1212) {
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 1) || (lVar21 == 6)) {
          if (*puVar12 < 7) {
            *(uint *)(this + 0x6c) = *puVar12;
            goto LAB_00124268;
          }
          goto LAB_001243b3;
        }
        uVar19 = 1;
        Context_00 = (ALCcontext *)0x1212;
      }
      else {
        if (iVar9 != 0x1214) {
          if (iVar9 != 0xc000) goto switchD_00123a48_caseD_1008;
          goto switchD_00123a48_caseD_1001;
        }
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 1) || (lVar21 == 6)) {
          uVar10 = *puVar12;
          Context_00 = (ALCcontext *)(ulong)uVar10;
          if (uVar10 < 3) {
            this[0x71] = SUB41(uVar10,0);
            bVar7 = true;
            UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
            goto LAB_00124340;
          }
          pcVar17 = "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n";
          AVar20 = 0xa003;
          if (1 < (int)gLogLevel) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported spatialize mode: 0x%04x\n",
                    (ulong)uVar10);
            pcVar17 = "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n";
            Context_00 = (ALCcontext *)(ulong)*puVar12;
          }
          goto LAB_0012432a;
        }
        uVar19 = 1;
        Context_00 = (ALCcontext *)0x1214;
      }
    }
    else {
      switch(iVar9) {
      case 0x20005:
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 1) || (lVar21 == 6)) {
          if (*puVar12 == 0) {
            *(undefined8 *)(this + 0x94) = 0x3f8000003f800000;
            *(undefined8 *)(this + 0x9c) = 0x3f800000459c4000;
            *(undefined4 *)(this + 0xa4) = 0x437a0000;
LAB_00124268:
            bVar7 = true;
            UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
            goto LAB_00124340;
          }
          __mutex = (pthread_mutex_t *)&device->FilterLock;
          iVar9 = pthread_mutex_lock(__mutex);
          if (iVar9 != 0) {
            std::__throw_system_error(iVar9);
          }
          pFVar6 = (device->FilterList).
                   super__Vector_base<FilterSubList,_al::allocator<FilterSubList,_8UL>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = *puVar12 - 1;
          if (((ulong)(uVar10 >> 6) <
               (ulong)((long)(device->FilterList).
                             super__Vector_base<FilterSubList,_al::allocator<FilterSubList,_8UL>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pFVar6 >> 4)) &&
             (uVar13 = (ulong)((uVar10 >> 6) << 4),
             lVar21 = *(long *)((long)&pFVar6->Filters + uVar13),
             lVar21 != 0 &&
             (*(ulong *)((long)&pFVar6->FreeMask + uVar13) >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
            puVar4 = (undefined8 *)(lVar21 + 4 + (ulong)(uVar10 & 0x3f) * 0x28);
            uVar19 = puVar4[1];
            *(undefined8 *)(this + 0x94) = *puVar4;
            *(undefined8 *)(this + 0x9c) = uVar19;
            *(undefined4 *)(this + 0xa4) =
                 *(undefined4 *)(lVar21 + 0x14 + (ulong)(uVar10 & 0x3f) * 0x28);
            pthread_mutex_unlock(__mutex);
            goto LAB_00124268;
          }
          ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid filter ID %u");
          goto LAB_0012444f;
        }
        uVar19 = 1;
        Context_00 = (ALCcontext *)0x20005;
        break;
      case 0x20006:
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 3) || (lVar21 == 6)) {
          local_48._0_8_ = &Source->DirectChannels;
          local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
          std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
          local_48[8] = 1;
          std::unique_lock<std::mutex>::operator=(&local_88,(unique_lock<std::mutex> *)local_48);
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
          uVar10 = *puVar12;
          Context_00 = (ALCcontext *)(ulong)uVar10;
          if (uVar10 == 0) {
            lVar21 = 0;
          }
          else {
            lVar14 = *(long *)((Source->OrientAt)._M_elems + 1);
            uVar10 = uVar10 - 1;
            pcVar17 = "Invalid effect ID %u";
            AVar20 = 0xa003;
            if (((ulong)(*(long *)(Source->OrientUp)._M_elems - lVar14 >> 4) <= (ulong)(uVar10 >> 6)
                ) || (uVar13 = (ulong)((uVar10 >> 6) << 4), lVar21 = *(long *)(lVar14 + 8 + uVar13),
                     lVar21 == 0 || (*(ulong *)(lVar14 + uVar13) >> ((ulong)uVar10 & 0x3f) & 1) != 0
                     )) goto LAB_0012432a;
            lVar21 = lVar21 + (ulong)(uVar10 & 0x3f) * 0x1e8;
          }
          Context_00 = (ALCcontext *)(ulong)puVar12[1];
          if (device->NumAuxSends <= puVar12[1]) {
            pcVar17 = "Invalid send %u";
            AVar20 = 0xa003;
            goto LAB_0012432a;
          }
          if (puVar12[2] == 0) {
            *(undefined8 *)(this + (long)Context_00 * 0x20 + 0xb0) = 0x3f8000003f800000;
            *(undefined8 *)(this + (long)Context_00 * 0x20 + 0xb0 + 8) = 0x3f800000459c4000;
            *(undefined4 *)(this + (long)Context_00 * 0x20 + 0xc0) = 0x437a0000;
          }
          else {
            __mutex = (pthread_mutex_t *)&device->FilterLock;
            iVar9 = pthread_mutex_lock(__mutex);
            if (iVar9 != 0) {
              std::__throw_system_error(iVar9);
            }
            pFVar6 = (device->FilterList).
                     super__Vector_base<FilterSubList,_al::allocator<FilterSubList,_8UL>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar10 = puVar12[2] - 1;
            if (((ulong)((long)(device->FilterList).
                               super__Vector_base<FilterSubList,_al::allocator<FilterSubList,_8UL>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar6 >> 4) <=
                 (ulong)(uVar10 >> 6)) ||
               (uVar13 = (ulong)((uVar10 >> 6) << 4),
               lVar14 = *(long *)((long)&pFVar6->Filters + uVar13),
               lVar14 == 0 ||
               (*(ulong *)((long)&pFVar6->FreeMask + uVar13) >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
              ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid filter ID %u");
              goto LAB_0012444f;
            }
            uVar2 = puVar12[1];
            puVar4 = (undefined8 *)(lVar14 + 4 + (ulong)(uVar10 & 0x3f) * 0x28);
            uVar19 = puVar4[1];
            *(undefined8 *)(this + (ulong)uVar2 * 0x20 + 0xb0) = *puVar4;
            *(undefined8 *)(this + (ulong)uVar2 * 0x20 + 0xb0 + 8) = uVar19;
            *(undefined4 *)(this + (ulong)uVar2 * 0x20 + 0xc0) =
                 *(undefined4 *)(lVar14 + 0x14 + (ulong)(uVar10 & 0x3f) * 0x28);
            pthread_mutex_unlock(__mutex);
            Context_00 = (ALCcontext *)(ulong)puVar12[1];
          }
          lVar14 = *(long *)(this + (long)Context_00 * 0x20 + 0xa8);
          if ((lVar21 == lVar14) || ((*(uint *)(this + 0x178) & 0xfffffffe) != 0x1012)) {
            if (lVar21 != 0) {
              LOCK();
              *(int *)(lVar21 + 0x98) = *(int *)(lVar21 + 0x98) + 1;
              UNLOCK();
              Context_00 = (ALCcontext *)(ulong)puVar12[1];
              lVar14 = *(long *)(this + (long)Context_00 * 0x20 + 0xa8);
            }
            if (lVar14 != 0) {
              LOCK();
              *(int *)(lVar14 + 0x98) = *(int *)(lVar14 + 0x98) + -1;
              UNLOCK();
              Context_00 = (ALCcontext *)(ulong)puVar12[1];
            }
            *(long *)(this + (long)Context_00 * 0x20 + 0xa8) = lVar21;
            goto LAB_00124268;
          }
          if (lVar21 != 0) {
            LOCK();
            *(int *)(lVar21 + 0x98) = *(int *)(lVar21 + 0x98) + 1;
            UNLOCK();
            Context_00 = (ALCcontext *)(ulong)puVar12[1];
            lVar14 = *(long *)(this + (long)Context_00 * 0x20 + 0xa8);
          }
          if (lVar14 != 0) {
            LOCK();
            *(int *)(lVar14 + 0x98) = *(int *)(lVar14 + 0x98) + -1;
            UNLOCK();
            Context_00 = (ALCcontext *)(ulong)puVar12[1];
          }
          *(long *)(this + (long)Context_00 * 0x20 + 0xa8) = lVar21;
          if (((ulong)*(uint *)(this + 0x18c) < *(ulong *)&(Source->Send)._M_elems[5].LFReference)
             && (pVVar3 = *(Voice **)
                           (*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                           (ulong)*(uint *)(this + 0x18c) * 8),
                (pVVar3->mSourceID).super___atomic_base<unsigned_int>._M_i ==
                *(__int_type *)(this + 400))) {
            bVar7 = true;
            UpdateSourceProps((ALsource *)this,pVVar3,(ALCcontext *)Source);
            goto LAB_00124340;
          }
          *(undefined4 *)(this + 0x18c) = 0xffffffff;
          this[0x188] = (anon_unknown_dwarf_54919)0x0;
LAB_00123cb8:
          bVar7 = true;
          goto LAB_00124340;
        }
        uVar19 = 3;
        Context_00 = (ALCcontext *)0x20006;
        break;
      case 0x20007:
      case 0x20008:
      case 0x20009:
        goto switchD_00123a48_caseD_1001;
      case 0x2000a:
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 1) || (lVar21 == 6)) {
          if (*puVar12 < 2) {
            this[0x72] = SUB41(*puVar12,0);
            goto LAB_00124268;
          }
LAB_001243b3:
          bVar7 = false;
          ALCcontext::setError((ALCcontext *)Source,0xa003,"Value out of range");
          goto LAB_00124340;
        }
        uVar19 = 1;
        Context_00 = (ALCcontext *)0x2000a;
        break;
      case 0x2000b:
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 1) || (lVar21 == 6)) {
          if (*puVar12 < 2) {
            this[0x73] = SUB41(*puVar12,0);
            goto LAB_00124268;
          }
          goto LAB_001243b3;
        }
        uVar19 = 1;
        Context_00 = (ALCcontext *)0x2000b;
        break;
      case 0x2000c:
        lVar21 = (long)piVar15 - (long)puVar12 >> 2;
        if ((lVar21 == 1) || (lVar21 == 6)) {
          if (*puVar12 < 2) {
            this[0x74] = SUB41(*puVar12,0);
            goto LAB_00124268;
          }
          goto LAB_001243b3;
        }
        uVar19 = 1;
        Context_00 = (ALCcontext *)0x2000c;
        break;
      default:
        if (iVar9 == 0xd000) {
          lVar21 = (long)piVar15 - (long)puVar12 >> 2;
          goto LAB_001241e5;
        }
        goto switchD_00123a48_caseD_1008;
      }
    }
    goto LAB_00124195;
  }
  switch(iVar9) {
  case 0x1001:
  case 0x1002:
  case 0x1003:
  case 0x100a:
  case 0x100d:
  case 0x100e:
  case 0x1020:
  case 0x1021:
  case 0x1022:
  case 0x1023:
  case 0x1031:
switchD_00123a48_caseD_1001:
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 1) || (lVar21 == 6)) {
      poVar16 = (optional<(anonymous_namespace)::VoicePos> *)(local_78 + 4);
      uVar10 = *puVar12;
LAB_00123a6b:
      *(float *)((long)&poVar16[-1].field_1 + 0xc) = (float)(int)uVar10;
LAB_00123a71:
      values_00.mData = (pointer)poVar16;
      bVar7 = SetSourcefv(this,Source,Context_00,(SourceProp)local_78,values_00);
      goto LAB_00124340;
    }
    goto LAB_0012462e;
  case 0x1004:
  case 0x1005:
  case 0x1006:
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 3) || (lVar21 == 6)) {
      poVar16 = (optional<(anonymous_namespace)::VoicePos> *)afStack_6c;
      local_78 = (undefined1  [8])
                 CONCAT44((float)(int)((ulong)*(undefined8 *)puVar12 >> 0x20),
                          (float)(int)*(undefined8 *)puVar12);
      uVar10 = puVar12[2];
      goto LAB_00123a6b;
    }
    uVar19 = 3;
    break;
  case 0x1007:
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 1) || (lVar21 == 6)) {
      if (*puVar12 < 2) {
        this[0x65] = SUB41(*puVar12,0);
        bVar7 = true;
        if ((*(uint *)(this + 0x178) & 0xfffffffe) == 0x1012) {
          if (((ulong)*(uint *)(this + 0x18c) < *(ulong *)&(Source->Send)._M_elems[5].LFReference)
             && (lVar21 = *(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                                   (ulong)*(uint *)(this + 0x18c) * 8),
                *(int *)(lVar21 + 0x170) == *(int *)(this + 400))) {
            if (this[0x65] == (anon_unknown_dwarf_54919)0x1) {
              uVar19 = *(undefined8 *)(this + 0x180);
            }
            else {
              uVar19 = 0;
            }
            *(undefined8 *)(lVar21 + 400) = uVar19;
            do {
            } while (((device->MixCount).super___atomic_base<unsigned_int>._M_i & 1) != 0);
          }
          else {
            *(undefined4 *)(this + 0x18c) = 0xffffffff;
          }
        }
        goto LAB_00124340;
      }
      goto LAB_001243b3;
    }
    uVar19 = 1;
    Context_00 = (ALCcontext *)0x1007;
    break;
  case 0x1008:
  case 0x100b:
  case 0x100c:
  case 0x1011:
  case 0x1012:
  case 0x1013:
  case 0x1014:
  case 0x1017:
  case 0x1018:
  case 0x1019:
  case 0x101a:
  case 0x101b:
  case 0x101c:
  case 0x101d:
  case 0x101e:
  case 0x101f:
  case 0x1028:
  case 0x1029:
  case 0x102a:
  case 0x102b:
  case 0x102c:
  case 0x102d:
  case 0x102e:
  case 0x102f:
  case 0x1030:
  case 0x1032:
switchD_00123a48_caseD_1008:
    pcVar17 = "Invalid source integer property 0x%04x";
    AVar20 = 0xa002;
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
      pcVar17 = "Invalid source integer property 0x%04x";
    }
    goto LAB_0012432a;
  case 0x1009:
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 1) || (lVar21 == 6)) {
      if (((ulong)*(uint *)(this + 0x18c) < *(ulong *)&(Source->Send)._M_elems[5].LFReference) &&
         (*(int *)(*(long *)(*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                            (ulong)*(uint *)(this + 0x18c) * 8) + 0x170) == *(int *)(this + 400))) {
        uVar10 = *(uint *)(this + 0x178);
LAB_001240a4:
        if ((uVar10 & 0xfffffffe) == 0x1012) {
          bVar7 = false;
          ALCcontext::setError
                    ((ALCcontext *)Source,0xa004,"Setting buffer on playing or paused source %u",
                     (ulong)*(uint *)(this + 400));
          goto LAB_00124340;
        }
      }
      else {
        *(undefined4 *)(this + 0x18c) = 0xffffffff;
        uVar10 = *(uint *)(this + 0x178);
        if (uVar10 != 0x1012) goto LAB_001240a4;
        *(undefined4 *)(this + 0x178) = 0x1014;
      }
      puVar4 = *(undefined8 **)(this + 0x180);
      if (*puVar12 == 0) {
        *(undefined4 *)(this + 0x174) = 0x1030;
        *(undefined8 *)(this + 0x180) = 0;
LAB_0012454c:
        bVar7 = true;
        while (puVar4 != (undefined8 *)0x0) {
          puVar11 = (undefined8 *)*puVar4;
          if (puVar4[2] != 0) {
            LOCK();
            piVar1 = (int *)(puVar4[2] + 0x70);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          al_free(puVar4);
          puVar4 = puVar11;
        }
        goto LAB_00124340;
      }
      __mutex = (pthread_mutex_t *)&device->BufferLock;
      iVar9 = pthread_mutex_lock(__mutex);
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      uVar13 = (ulong)*puVar12;
      pBVar5 = (device->BufferList).
               super__Vector_base<BufferSubList,_al::allocator<BufferSubList,_8UL>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = *puVar12 - 1;
      pcVar17 = "Invalid buffer ID %u";
      AVar20 = 0xa003;
      if (((ulong)(uVar10 >> 6) <
           (ulong)((long)(device->BufferList).
                         super__Vector_base<BufferSubList,_al::allocator<BufferSubList,_8UL>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pBVar5 >> 4)) &&
         (uVar18 = (ulong)((uVar10 >> 6) << 4), lVar21 = *(long *)((long)&pBVar5->Buffers + uVar18),
         lVar21 != 0 &&
         (*(ulong *)((long)&pBVar5->FreeMask + uVar18) >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
        lVar21 = lVar21 + (ulong)(uVar10 & 0x3f) * 0x78;
        if (*(uint *)(lVar21 + 100) == 0 || (*(uint *)(lVar21 + 100) & 4) != 0) {
          if ((*(long *)(lVar21 + 0x18) == 0) || (*(int *)(lVar21 + 0x70) == 0)) {
            puVar11 = (undefined8 *)BufferlistItem::operator_new((BufferlistItem *)0x18,0xa003);
            *puVar11 = 0;
            *(undefined4 *)(puVar11 + 1) = *(undefined4 *)(lVar21 + 0x30);
            puVar11[2] = lVar21;
            LOCK();
            *(int *)(lVar21 + 0x70) = *(int *)(lVar21 + 0x70) + 1;
            UNLOCK();
            *(undefined4 *)(this + 0x174) = 0x1028;
            *(undefined8 **)(this + 0x180) = puVar11;
            pthread_mutex_unlock(__mutex);
            goto LAB_0012454c;
          }
          pcVar17 = "Setting already-set callback buffer %u";
        }
        else {
          pcVar17 = "Setting non-persistently mapped buffer %u";
        }
        uVar13 = (ulong)*(uint *)(lVar21 + 0x74);
        AVar20 = 0xa004;
      }
      ALCcontext::setError((ALCcontext *)Source,AVar20,pcVar17,uVar13);
LAB_0012444f:
      pthread_mutex_unlock(__mutex);
LAB_00124454:
      bVar7 = false;
      goto LAB_00124340;
    }
    uVar19 = 1;
    Context_00 = (ALCcontext *)0x1009;
    break;
  case 0x100f:
    if ((long)piVar15 - (long)puVar12 == 0x18) {
      poVar16 = &local_60;
      fStack_70 = (float)(int)puVar12[2];
      afStack_6c[0] = (float)(int)puVar12[3];
      local_78._4_4_ = (float)(int)puVar12[1];
      local_78._0_4_ = (float)(int)*puVar12;
      afStack_6c[2] = (float)(int)((ulong)*(undefined8 *)(puVar12 + 4) >> 0x20);
      afStack_6c[1] = (float)(int)*(undefined8 *)(puVar12 + 4);
      Context_00 = (ALCcontext *)0x100f;
      goto LAB_00123a71;
    }
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    uVar19 = 6;
    Context_00 = (ALCcontext *)0x100f;
    break;
  case 0x1010:
  case 0x1015:
  case 0x1016:
  case 0x1027:
    pcVar17 = "Setting read-only source property 0x%04x";
    AVar20 = 0xa004;
LAB_0012432a:
    bVar7 = false;
    ALCcontext::setError((ALCcontext *)Source,AVar20,pcVar17,Context_00);
    goto LAB_00124340;
  case 0x1024:
  case 0x1025:
  case 0x1026:
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 1) || (lVar21 == 6)) {
      if ((int)*puVar12 < 0) goto LAB_001243b3;
      if ((*(ulong *)&(Source->Send)._M_elems[5].LFReference <= (ulong)*(uint *)(this + 0x18c)) ||
         (pVVar3 = *(Voice **)
                    (*(long *)&(Source->Send)._M_elems[5].HFReference + 8 +
                    (ulong)*(uint *)(this + 0x18c) * 8),
         (pVVar3->mSourceID).super___atomic_base<unsigned_int>._M_i != *(__int_type *)(this + 400)))
      {
        *(undefined4 *)(this + 0x18c) = 0xffffffff;
LAB_00123ca1:
        *(int *)(this + 0x170) = iVar9;
        *(double *)(this + 0x168) = (double)(int)*puVar12;
        goto LAB_00123cb8;
      }
      if ((pVVar3->mFlags & 2) != 0) {
        bVar7 = false;
        ALCcontext::setError((ALCcontext *)Source,0xa003,"Source offset for callback is invalid");
        goto LAB_00124340;
      }
      GetSampleOffset(&local_60,*(BufferlistItem **)(this + 0x180),iVar9,(double)(int)*puVar12);
      if (local_60.mHasValue != false) {
        local_48._8_8_ = local_60.field_1._0_8_;
        pBStack_38 = local_60.field_1.mValue.bufferitem;
        local_48[0] = 1;
        bVar8 = SetVoiceOffset(pVVar3,(VoicePos *)(local_48 + 8),(ALsource *)this,
                               (ALCcontext *)Source,device);
        bVar7 = true;
        if (bVar8) goto LAB_00124340;
        goto LAB_00123ca1;
      }
      ALCcontext::setError((ALCcontext *)Source,0xa003,"Invalid source offset");
      goto LAB_00124454;
    }
LAB_0012462e:
    uVar19 = 1;
    break;
  case 0x1033:
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 1) || (lVar21 == 6)) {
      uVar10 = *puVar12;
      if (uVar10 < 3) {
        this[0x70] = SUB41(uVar10,0);
        bVar7 = true;
        UpdateSourceProps((ALsource *)this,(ALCcontext *)Source);
        goto LAB_00124340;
      }
      if (1 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Unsupported direct mode: 0x%04x\n",(ulong)uVar10);
        uVar10 = *puVar12;
      }
      ALCcontext::setError
                ((ALCcontext *)Source,0xa003,"Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
                 (ulong)uVar10);
LAB_001241e5:
      if ((lVar21 == 1) || (lVar21 == 6)) {
        uVar10 = *puVar12;
        if ((uVar10 - 0xd001 < 6) || (uVar10 == 0)) {
          *(uint *)(this + 0x68) = uVar10;
          bVar7 = true;
          if (*(char *)&(Source->Direct).GainLF == '\0') goto LAB_00124340;
          goto LAB_00124268;
        }
        goto LAB_001243b3;
      }
      goto LAB_0012462e;
    }
    uVar19 = 1;
    Context_00 = (ALCcontext *)0x1033;
    break;
  default:
    if (iVar9 != 0x202) goto switchD_00123a48_caseD_1008;
    lVar21 = (long)piVar15 - (long)puVar12 >> 2;
    if ((lVar21 == 1) || (lVar21 == 6)) {
      if (*puVar12 < 2) {
        this[100] = SUB41(*puVar12,0);
        goto LAB_00124268;
      }
      goto LAB_001243b3;
    }
    uVar19 = 1;
    Context_00 = (ALCcontext *)0x202;
  }
LAB_00124195:
  bVar7 = false;
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uVar19,lVar21);
LAB_00124340:
  std::unique_lock<std::mutex>::~unique_lock(&local_88);
  return bVar7;
}

Assistant:

bool SetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const int> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ALeffectslot *slot{nullptr};
    BufferlistItem *oldlist{nullptr};
    std::unique_lock<std::mutex> slotlock;
    float fvals[6];

    switch(prop)
    {
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->HeadRelative = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->Looping = values[0] != AL_FALSE;
        if(IsPlayingOrPaused(Source))
        {
            if(Voice *voice{GetSourceVoice(Source, Context)})
            {
                if(Source->Looping)
                    voice->mLoopBuffer.store(Source->queue, std::memory_order_release);
                else
                    voice->mLoopBuffer.store(nullptr, std::memory_order_release);

                /* If the source is playing, wait for the current mix to finish
                 * to ensure it isn't currently looping back or reaching the
                 * end.
                 */
                device->waitForMix();
            }
        }
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            const ALenum state{GetSourceState(Source, GetSourceVoice(Source, Context))};
            if(state == AL_PLAYING || state == AL_PAUSED)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting buffer on playing or paused source %u", Source->id);
        }
        oldlist = Source->queue;
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->BufferLock};
            ALbuffer *buffer{LookupBuffer(device, static_cast<ALuint>(values[0]))};
            if(!buffer)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid buffer ID %u",
                    static_cast<ALuint>(values[0]));
            if(buffer->MappedAccess && !(buffer->MappedAccess&AL_MAP_PERSISTENT_BIT_SOFT))
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting non-persistently mapped buffer %u", buffer->id);
            if(buffer->mBuffer.mCallback && ReadRef(buffer->ref) != 0)
                SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
                    "Setting already-set callback buffer %u", buffer->id);

            /* Add the selected buffer to a one-item queue */
            auto newlist = new BufferlistItem{};
            newlist->mSampleLen = buffer->mBuffer.mSampleLen;
            newlist->mBuffer = &buffer->mBuffer;
            IncrementRef(buffer->ref);

            /* Source is now Static */
            Source->SourceType = AL_STATIC;
            Source->queue = newlist;
        }
        else
        {
            /* Source is now Undetermined */
            Source->SourceType = AL_UNDETERMINED;
            Source->queue = nullptr;
        }

        /* Delete all elements in the previous queue */
        while(oldlist != nullptr)
        {
            std::unique_ptr<BufferlistItem> temp{oldlist};
            oldlist = temp->mNext.load(std::memory_order_relaxed);

            if(BufferStorage *buffer{temp->mBuffer})
                DecrementRef(BufferFromStorage(buffer)->ref);
        }
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid source offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, device))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_DIRECT_FILTER:
        CHECKSIZE(values, 1);
        if(values[0])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[0]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u",
                    static_cast<ALuint>(values[0]));
            Source->Direct.Gain = filter->Gain;
            Source->Direct.GainHF = filter->GainHF;
            Source->Direct.HFReference = filter->HFReference;
            Source->Direct.GainLF = filter->GainLF;
            Source->Direct.LFReference = filter->LFReference;
        }
        else
        {
            Source->Direct.Gain = 1.0f;
            Source->Direct.GainHF = 1.0f;
            Source->Direct.HFReference = LOWPASSFREQREF;
            Source->Direct.GainLF = 1.0f;
            Source->Direct.LFReference = HIGHPASSFREQREF;
        }
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->DryGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_FALSE || values[0] == AL_TRUE);

        Source->WetGainHFAuto = values[0] != AL_FALSE;
        return UpdateSourceProps(Source, Context);

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = DirectModeFromEnum(values[0]))
        {
            Source->DirectChannels = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_DIRECT_CHANNELS_SOFT: 0x%04x\n",
            values[0]);

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] == AL_NONE ||
            values[0] == AL_INVERSE_DISTANCE || values[0] == AL_INVERSE_DISTANCE_CLAMPED ||
            values[0] == AL_LINEAR_DISTANCE || values[0] == AL_LINEAR_DISTANCE_CLAMPED ||
            values[0] == AL_EXPONENT_DISTANCE || values[0] == AL_EXPONENT_DISTANCE_CLAMPED);

        Source->mDistanceModel = static_cast<DistanceModel>(values[0]);
        if(Context->mSourceDistanceModel)
            return UpdateSourceProps(Source, Context);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0 && values[0] <= static_cast<int>(Resampler::Max));

        Source->mResampler = static_cast<Resampler>(values[0]);
        return UpdateSourceProps(Source, Context);

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if(auto mode = SpatializeModeFromEnum(values[0]))
        {
            Source->mSpatialize = *mode;
            return UpdateSourceProps(Source, Context);
        }
        Context->setError(AL_INVALID_VALUE, "Unsupported AL_SOURCE_SPATIALIZE_SOFT: 0x%04x\n",
            values[0]);
        return false;

    case AL_AUXILIARY_SEND_FILTER:
        CHECKSIZE(values, 3);
        slotlock = std::unique_lock<std::mutex>{Context->mEffectSlotLock};
        if(values[0] && (slot=LookupEffectSlot(Context, static_cast<ALuint>(values[0]))) == nullptr)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid effect ID %u", values[0]);
        if(static_cast<ALuint>(values[1]) >= device->NumAuxSends)
            SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid send %u", values[1]);

        if(values[2])
        {
            std::lock_guard<std::mutex> _{device->FilterLock};
            ALfilter *filter{LookupFilter(device, static_cast<ALuint>(values[2]))};
            if(!filter)
                SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid filter ID %u", values[2]);

            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = filter->Gain;
            send.GainHF = filter->GainHF;
            send.HFReference = filter->HFReference;
            send.GainLF = filter->GainLF;
            send.LFReference = filter->LFReference;
        }
        else
        {
            /* Disable filter */
            auto &send = Source->Send[static_cast<ALuint>(values[1])];
            send.Gain = 1.0f;
            send.GainHF = 1.0f;
            send.HFReference = LOWPASSFREQREF;
            send.GainLF = 1.0f;
            send.LFReference = HIGHPASSFREQREF;
        }

        if(slot != Source->Send[static_cast<ALuint>(values[1])].Slot && IsPlayingOrPaused(Source))
        {
            /* Add refcount on the new slot, and release the previous slot */
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;

            /* We must force an update if the auxiliary slot changed on an
             * active source, in case the slot is about to be deleted.
             */
            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice) UpdateSourceProps(Source, voice, Context);
            else Source->PropsClean.clear(std::memory_order_release);
        }
        else
        {
            if(slot) IncrementRef(slot->ref);
            if(auto *oldslot = Source->Send[static_cast<ALuint>(values[1])].Slot)
                DecrementRef(oldslot->ref);
            Source->Send[static_cast<ALuint>(values[1])].Slot = slot;
            UpdateSourceProps(Source, Context);
        }
        return true;


    /* 1x float */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_DOPPLER_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        fvals[0] = static_cast<float>(values[0]);
        return SetSourcefv(Source, Context, prop, {fvals, 1u});

    /* 3x float */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        return SetSourcefv(Source, Context, prop, {fvals, 3u});

    /* 6x float */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        fvals[3] = static_cast<float>(values[3]);
        fvals[4] = static_cast<float>(values[4]);
        fvals[5] = static_cast<float>(values[5]);
        return SetSourcefv(Source, Context, prop, {fvals, 6u});

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
    case AL_STEREO_ANGLES:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}